

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
::destroy_slots(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                *this)

{
  undefined1 auVar1 [16];
  uint uVar2;
  undefined1 *puVar3;
  ushort uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 (*pauVar7) [16];
  uint uVar8;
  long lVar9;
  anon_class_16_2_3fe5d3b9 f;
  anon_class_16_2_3fe5d3b9 f_00;
  slot_type *local_40;
  ulong local_38;
  
  lVar9 = *(long *)((long)&(this->settings_).
                           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                           .
                           super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                           .value.heap_or_soo_ + 8);
  uVar6 = (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  pauVar7 = (undefined1 (*) [16])
            (this->settings_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            heap_or_soo_.heap.control;
  if (uVar6 < 0xf) {
    if (8 < uVar6) {
      __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x78b,
                    "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, bool>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3658:9)]"
                   );
    }
    uVar6 = *(ulong *)(*pauVar7 + uVar6) & 0x8080808080808080;
    if (uVar6 != 0x8080808080808080) {
      uVar6 = uVar6 ^ 0x8080808080808080;
      do {
        uVar5 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        local_40 = (slot_type *)(lVar9 + -0x28 + (uVar5 >> 3 & 0x1fffffff) * 0x28);
        f.slot = &local_40;
        f.this = this;
        CommonFields::
        RunWithReentrancyGuard<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>::destroy(absl::lts_20250127::container_internal::map_slot_type<std::__cxx11::string,bool>*)::_lambda()_1_>
                  ((CommonFields *)this,f);
        uVar6 = uVar6 & uVar6 - 1;
      } while (uVar6 != 0);
    }
  }
  else {
    uVar6 = (this->settings_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            size_;
    uVar5 = uVar6 >> 1;
    local_38 = uVar5;
    if (1 < uVar6) {
      while( true ) {
        auVar1 = *pauVar7;
        uVar8 = (uint)(ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar1[0xf] >> 7) << 0xf);
        if (uVar8 != 0xffff) {
          uVar8 = ~uVar8;
          do {
            uVar2 = 0;
            if (uVar8 != 0) {
              for (; (uVar8 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
              }
            }
            if ((char)(*pauVar7)[uVar2] < '\0') {
              __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x79d,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, bool>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3658:9)]"
                           );
            }
            local_40 = (slot_type *)(lVar9 + (ulong)uVar2 * 0x28);
            f_00.slot = &local_40;
            f_00.this = this;
            CommonFields::
            RunWithReentrancyGuard<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>::destroy(absl::lts_20250127::container_internal::map_slot_type<std::__cxx11::string,bool>*)::_lambda()_1_>
                      ((CommonFields *)this,f_00);
            uVar5 = uVar5 - 1;
            uVar4 = (ushort)(uVar8 - 1) & (ushort)uVar8;
            uVar8 = CONCAT22((short)(uVar8 - 1 >> 0x10),uVar4);
          } while (uVar4 != 0);
        }
        if (uVar5 == 0) break;
        lVar9 = lVar9 + 0x280;
        puVar3 = *pauVar7;
        pauVar7 = pauVar7 + 1;
        if (puVar3[0xf] == -1) {
          __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7a5,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, bool>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3658:9)]"
                       );
        }
      }
    }
    if (local_38 <
        (this->settings_).
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_
        >> 1) {
      __assert_fail("(original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x7aa,
                    "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, bool>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3658:9)]"
                   );
    }
  }
  return;
}

Assistant:

inline void destroy_slots() {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    if (PolicyTraits::template destroy_is_trivial<Alloc>()) return;
    IterateOverFullSlots(
        common(), slot_array(),
        [&](const ctrl_t*, slot_type* slot)
            ABSL_ATTRIBUTE_ALWAYS_INLINE { this->destroy(slot); });
  }